

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O3

void __thiscall
enact::ReferenceTypename::ReferenceTypename
          (ReferenceTypename *this,optional<enact::Token> *permission,optional<enact::Token> *region
          ,unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
           *referringTypename)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ReferenceTypename_001279c8;
  std::_Optional_payload_base<enact::Token>::_Optional_payload_base
            ((_Optional_payload_base<enact::Token> *)&this->m_permission,
             (permission->super__Optional_base<enact::Token,_false,_false>)._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_engaged,
             (_Optional_payload_base<enact::Token> *)permission);
  std::_Optional_payload_base<enact::Token>::_Optional_payload_base
            ((_Optional_payload_base<enact::Token> *)&this->m_region,
             (region->super__Optional_base<enact::Token,_false,_false>)._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_engaged,
             (_Optional_payload_base<enact::Token> *)region);
  (this->m_referringTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (referringTypename->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (referringTypename->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  local_70[0] = local_60;
  if ((this->m_permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    lVar3 = *(long *)&(this->m_permission).super__Optional_base<enact::Token,_false,_false>.
                      _M_payload.super__Optional_payload<enact::Token,_true,_false,_false>.
                      super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.
                      _M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,lVar3,
               *(size_type *)
                ((long)&(this->m_permission).super__Optional_base<enact::Token,_false,_false>.
                        _M_payload.super__Optional_payload<enact::Token,_true,_false,_false>.
                        super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme + 8) +
               lVar3);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>();
  }
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x11d35e);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_80 = *puVar8;
    uStack_78 = (undefined4)plVar5[3];
    uStack_74 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar8;
    local_90 = (ulong *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((this->m_region).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    local_b0 = local_a0;
    lVar3 = *(long *)&(this->m_region).super__Optional_base<enact::Token,_false,_false>._M_payload.
                      super__Optional_payload<enact::Token,_true,_false,_false>.
                      super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.
                      _M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,lVar3,
               *(size_type *)
                ((long)&(this->m_region).super__Optional_base<enact::Token,_false,_false>._M_payload
                        .super__Optional_payload<enact::Token,_true,_false,_false>.
                        super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme + 8) +
               lVar3);
  }
  else {
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  }
  uVar9 = 0xf;
  if (local_90 != &local_80) {
    uVar9 = local_80;
  }
  if (uVar9 < (ulong)(local_a8 + local_88)) {
    uVar9 = 0xf;
    if (local_b0 != local_a0) {
      uVar9 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_88) <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_001170dd;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_001170dd:
  paVar2 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar4 = puVar6[3];
    paVar2->_M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&(this->m_name).field_2 + 8) = uVar4;
  }
  else {
    (this->m_name)._M_dataplus._M_p = (pointer)*puVar6;
    (this->m_name).field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_name)._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

ReferenceTypename::ReferenceTypename(
            std::optional<Token> permission,
            std::optional<Token> region,
            std::unique_ptr<const Typename> referringTypename) :
            m_permission{std::move(permission)},
            m_region{std::move(region)},
            m_referringTypename{std::move(referringTypename)},
            m_name{
                    "&" +
                    (m_permission ? m_permission->lexeme : "") + " " +
                    (m_region ? m_region->lexeme : "")} {
    }